

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O1

void __thiscall
amrex::BndryRegister::define
          (BndryRegister *this,BoxArray *grids_,DistributionMapping *dmap,int in_rad,int out_rad,
          int extent_rad,int ncomp)

{
  long lVar1;
  BoxArray *pBVar2;
  BoxArray *pBVar3;
  Orientation _face;
  
  pBVar2 = grids_;
  pBVar3 = &this->grids;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)&pBVar3->m_bat = *(undefined8 *)&pBVar2->m_bat;
    pBVar2 = (BoxArray *)&(pBVar2->m_bat).m_op.m_bndryReg.m_typ;
    pBVar3 = (BoxArray *)&(pBVar3->m_bat).m_op.m_bndryReg.m_typ;
  }
  (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (grids_->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(grids_->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->grids).m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (grids_->m_simplified_list).
           super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->grids).m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(grids_->m_simplified_list).
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _face.val = 0;
  do {
    define(this,_face,(IndexType)0x0,in_rad,out_rad,extent_rad,ncomp,dmap);
    _face.val = _face.val + 1;
  } while (_face.val != 6);
  return;
}

Assistant:

void
BndryRegister::define (const BoxArray& grids_,
                       const DistributionMapping& dmap,
                       int             in_rad,
                       int             out_rad,
                       int             extent_rad,
                       int             ncomp)
{
    grids = grids_;
    for (OrientationIter face; face; ++face)
    {
        define(face(),IndexType::TheCellType(),in_rad,out_rad,extent_rad,ncomp,dmap);
    }
}